

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlValidatePopElement(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem,xmlChar *qname)

{
  xmlElementPtr pxVar1;
  int iVar2;
  uint uVar3;
  xmlValidState *pxVar5;
  int iVar6;
  ulong uVar4;
  
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    iVar6 = 0;
  }
  else {
    iVar6 = 1;
    if ((0 < ctxt->vstateNr) && (pxVar5 = ctxt->vstate, pxVar5 != (xmlValidState *)0x0)) {
      if ((pxVar5->elemDecl != (xmlElementPtr)0x0) &&
         ((pxVar5->elemDecl->etype == XML_ELEMENT_TYPE_ELEMENT &&
          (pxVar5->exec != (xmlRegExecCtxtPtr)0x0)))) {
        iVar2 = xmlRegExecPushString(pxVar5->exec,(xmlChar *)0x0,(void *)0x0);
        if (iVar2 < 1) {
          if (iVar2 == -5) {
            xmlVErrMemory(ctxt);
          }
          iVar6 = 0;
        }
      }
      if (0 < ctxt->vstateNr) {
        uVar3 = ctxt->vstateNr - 1;
        uVar4 = (ulong)uVar3;
        ctxt->vstateNr = uVar3;
        pxVar5 = ctxt->vstateTab;
        pxVar1 = pxVar5[uVar4].elemDecl;
        pxVar5[uVar4].elemDecl = (xmlElementPtr)0x0;
        pxVar5[uVar4].node = (xmlNodePtr)0x0;
        if ((pxVar1 != (xmlElementPtr)0x0) && (pxVar1->etype == XML_ELEMENT_TYPE_ELEMENT)) {
          xmlRegFreeExecCtxt(pxVar5[uVar4].exec);
          pxVar5 = ctxt->vstateTab;
          uVar4 = (ulong)(uint)ctxt->vstateNr;
        }
        pxVar5[(int)uVar4].exec = (xmlRegExecCtxtPtr)0x0;
        pxVar5 = pxVar5 + (uVar4 - 1);
        if ((int)uVar4 < 1) {
          pxVar5 = (xmlValidState *)0x0;
        }
        ctxt->vstate = pxVar5;
      }
    }
  }
  return iVar6;
}

Assistant:

int
xmlValidatePopElement(xmlValidCtxtPtr ctxt, xmlDocPtr doc ATTRIBUTE_UNUSED,
                      xmlNodePtr elem ATTRIBUTE_UNUSED,
		      const xmlChar *qname ATTRIBUTE_UNUSED) {
    int ret = 1;

    if (ctxt == NULL)
        return(0);

    if ((ctxt->vstateNr > 0) && (ctxt->vstate != NULL)) {
	xmlValidStatePtr state = ctxt->vstate;
	xmlElementPtr elemDecl;

	/*
	 * Check the new element against the content model of the new elem.
	 */
	if (state->elemDecl != NULL) {
	    elemDecl = state->elemDecl;

	    if (elemDecl->etype == XML_ELEMENT_TYPE_ELEMENT) {
		if (state->exec != NULL) {
		    ret = xmlRegExecPushString(state->exec, NULL, NULL);
		    if (ret <= 0) {
                        if (ret == XML_REGEXP_OUT_OF_MEMORY)
                            xmlVErrMemory(ctxt);
			ret = 0;
		    } else {
			/*
			 * previous validation errors should not generate
			 * a new one here
			 */
			ret = 1;
		    }
		}
	    }
	}
	vstateVPop(ctxt);
    }
    return(ret);
}